

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O1

void RigidBodyDynamics::CompositeRigidBodyAlgorithm
               (Model *model,VectorNd *Q,MatrixNd *H,bool update_kinematics)

{
  double **ppdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pointer pSVar10;
  pointer pSVar11;
  pointer pJVar12;
  CustomJoint *pCVar13;
  pointer ppCVar14;
  pointer pMVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Scalar SVar31;
  Scalar SVar32;
  Scalar SVar33;
  Scalar SVar34;
  Scalar SVar35;
  undefined8 uVar36;
  Index IVar37;
  uint uVar38;
  ulong uVar39;
  pointer pMVar40;
  undefined8 *puVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  DenseStorage<double,__1,__1,__1,_0> *pDVar45;
  Index *pIVar46;
  ulong uVar47;
  Index col;
  long lVar48;
  ulong uVar49;
  Index row_1;
  double *pdVar50;
  Index row;
  double dVar51;
  long lVar52;
  ulong uVar53;
  Index row_2;
  ulong uVar54;
  pointer pSVar55;
  DenseStorage<double,__1,__1,__1,_0> *pDVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  MatrixNd H_temp2;
  MatrixNd F_Nd;
  SrcEvaluatorType srcEvaluator;
  type tmp_1;
  type tmp;
  DstEvaluatorType dstEvaluator;
  undefined1 local_3a1 [9];
  DenseStorage<double,__1,__1,__1,_0> local_398;
  ulong local_380;
  DenseStorage<double,__1,__1,__1,_0> local_378;
  DenseStorage<double,__1,__1,__1,_0> *local_358;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_350;
  DenseStorage<double,__1,__1,__1,_0> local_340;
  undefined1 local_328 [16];
  DenseStorage<double,__1,__1,__1,_0> *local_318;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *pDStack_310;
  double local_308 [5];
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8 [2];
  Matrix<double,_6,_6,_0,_6,_6> local_298;
  DenseStorage<double,__1,__1,__1,_0> *local_178;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *pDStack_170;
  double adStack_168 [2];
  Model *local_158;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *local_150;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *pDStack_130;
  double local_128 [5];
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  DenseStorage<double,__1,__1,__1,_0> *local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  uVar39 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  local_358 = (DenseStorage<double,__1,__1,__1,_0> *)Q;
  if (1 < uVar39) {
    uVar54 = 1;
    do {
      if (update_kinematics) {
        jcalc_X_lambda_S(model,(uint)uVar54,(VectorNd *)local_358);
      }
      pSVar10 = (model->I).
                super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar11 = (model->Ic).
                super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar11[uVar54].m = pSVar10[uVar54].m;
      dVar51 = *(double *)((long)&pSVar10[uVar54].h.super_Vector3d + 8);
      *(undefined8 *)&pSVar11[uVar54].h.super_Vector3d =
           *(undefined8 *)&pSVar10[uVar54].h.super_Vector3d;
      *(double *)((long)&pSVar11[uVar54].h.super_Vector3d + 8) = dVar51;
      *(double *)((long)&pSVar11[uVar54].h.super_Vector3d + 0x10) =
           *(double *)((long)&pSVar10[uVar54].h.super_Vector3d + 0x10);
      SVar31 = pSVar10[uVar54].Ixx;
      SVar32 = (&pSVar10[uVar54].Ixx)[1];
      SVar33 = pSVar10[uVar54].Iyy;
      SVar34 = (&pSVar10[uVar54].Iyy)[1];
      SVar35 = (&pSVar10[uVar54].Izy)[1];
      pSVar11[uVar54].Izy = pSVar10[uVar54].Izy;
      (&pSVar11[uVar54].Izy)[1] = SVar35;
      pSVar11[uVar54].Iyy = SVar33;
      (&pSVar11[uVar54].Iyy)[1] = SVar34;
      pSVar11[uVar54].Ixx = SVar31;
      (&pSVar11[uVar54].Ixx)[1] = SVar32;
      uVar54 = (ulong)((uint)uVar54 + 1);
      uVar39 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar54 <= uVar39 && uVar39 - uVar54 != 0);
  }
  uVar38 = (int)uVar39 - 1;
  if (uVar38 != 0) {
    uVar39 = (ulong)uVar38;
    adStack_168[1] = (double)(uVar39 * 0x90 + 0x28);
    local_158 = model;
    local_150 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                 *)H;
    do {
      uVar54 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar39];
      if (uVar54 != 0) {
        pSVar10 = (model->Ic).
                  super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)&local_298,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39,pSVar10 + uVar39);
        dVar57 = *(double *)&pSVar10[uVar54].h.super_Vector3d;
        dVar2 = *(double *)((long)&pSVar10[uVar54].h.super_Vector3d + 8);
        dVar51 = pSVar10[uVar54].Izz;
        uVar38 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar39];
        pSVar11 = (model->Ic).
                  super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar44 = (double *)((long)&pSVar10[uVar54].h.super_Vector3d + 0x10);
        dVar3 = *pdVar44;
        dVar58 = pdVar44[1];
        pSVar11[uVar38].m =
             pSVar10[uVar54].m +
             local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
             .array[0];
        dVar20 = pSVar10[uVar54].Iyx;
        dVar21 = (&pSVar10[uVar54].Iyx)[1];
        dVar18 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                 m_data.array[7] + pSVar10[uVar54].Izx;
        dVar19 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                 m_data.array[8] + (&pSVar10[uVar54].Izx)[1];
        *(double *)&pSVar11[uVar38].h.super_Vector3d =
             local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
             .array[1] + dVar57;
        *(double *)((long)&pSVar11[uVar38].h.super_Vector3d + 8) =
             local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
             .array[2] + dVar2;
        pdVar44 = (double *)((long)&pSVar11[uVar38].h.super_Vector3d + 0x10);
        *pdVar44 = dVar3 + local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                           m_storage.m_data.array[3];
        pdVar44[1] = dVar58 + local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                              .m_storage.m_data.array[4];
        pSVar11[uVar38].Iyx =
             local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
             .array[5] + dVar20;
        (&pSVar11[uVar38].Iyx)[1] =
             local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
             .array[6] + dVar21;
        auVar16._8_4_ = SUB84(dVar19,0);
        auVar16._0_8_ = dVar18;
        auVar16._12_4_ = (int)((ulong)dVar19 >> 0x20);
        pSVar11[uVar38].Izx = dVar18;
        pSVar11[uVar38].Izy = (Scalar)auVar16._8_8_;
        pSVar11[uVar38].Izz =
             dVar51 + local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[9];
      }
      pJVar12 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_3a1._1_8_ = ZEXT48(pJVar12[uVar39].q_index);
      uVar54 = uVar39;
      if (pJVar12[uVar39].mDoFCount == 3) {
        if (pJVar12[uVar39].mJointType == JointTypeCustom) goto LAB_0016fe44;
        Math::SpatialRigidBodyInertia::toMatrix
                  ((model->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39);
        pMVar15 = (model->multdof3_S).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pMVar40 = pMVar15 + uVar39;
        local_358 = (DenseStorage<double,__1,__1,__1,_0> *)
                    local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0];
        pDStack_350 = (DenseStorage<double,__1,__1,__1,_0> *)
                      local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[1];
        local_178 = (DenseStorage<double,__1,__1,__1,_0> *)
                    local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[2];
        pDStack_170 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                       *)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                         m_storage.m_data.array[3];
        local_a8 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
        dStack_a0 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[5];
        local_b8 = (DenseStorage<double,__1,__1,__1,_0> *)
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[6];
        dStack_b0 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[7];
        lVar42 = 0;
        do {
          dVar51 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x28);
          dVar18 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x20);
          dVar58 = dVar18 * dStack_b0;
          dVar19 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x18);
          dVar57 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1]);
          *(double *)((long)&local_148.m_data + lVar42) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1e] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x18] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x12] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xc] +
               dVar18 * (double)local_b8 +
               dVar51 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0];
          *(double *)((long)&local_148.m_rows + lVar42) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1f] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x19] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x13] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xd] +
               dVar58 + dVar51 * local_298.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[1];
          dVar51 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x28);
          dVar18 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x20);
          dVar19 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x18);
          dVar57 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1]);
          *(double *)((long)&local_148.m_cols + lVar42) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x20] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1a] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x14] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xe] +
               dVar18 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[8] +
               dVar51 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[2];
          *(double *)((long)&pDStack_130 + lVar42) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x21] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1b] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x15] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xf] +
               dVar18 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[9] +
               dVar51 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[3];
          dVar51 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x28);
          dVar18 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x20);
          dVar58 = dVar51 * dStack_a0;
          dVar19 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x18);
          dVar57 = *(double *)
                    ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar42 + (long)adStack_168[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar42 + (long)adStack_168[1]);
          *(double *)((long)local_128 + lVar42) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x22] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1c] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x16] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x10] +
               dVar18 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[10] + dVar51 * local_a8;
          *(double *)((long)local_128 + lVar42 + 8) =
               dVar3 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x23] +
               dVar2 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1d] +
               dVar57 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x17] +
               dVar19 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x11] +
               dVar18 * local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xb] + dVar58;
          lVar42 = lVar42 + 0x30;
        } while (lVar42 != 0x90);
        lVar42 = *(long *)H;
        lVar43 = *(long *)((long)H + 8);
        dVar51 = *(double *)
                  &(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
        ;
        dVar18 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 8);
        dVar19 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x10);
        dVar57 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x18);
        dVar2 = *(double *)
                 ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + 0x20);
        dVar3 = *(double *)
                 ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + 0x28);
        dVar58 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x30);
        dVar20 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x38);
        dVar21 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x40);
        dVar22 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x48);
        dVar23 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x50);
        dVar24 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x58);
        dVar25 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x60);
        dVar26 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x68);
        dVar27 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x70);
        dVar28 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x78);
        dVar29 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x80);
        dVar30 = *(double *)
                  ((long)&(pMVar40->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x88);
        lVar48 = 0x10;
        do {
          dVar4 = *(double *)((long)adStack_168 + lVar48 * 2);
          dVar5 = *(double *)((long)adStack_168 + lVar48 * 2 + 8);
          dVar6 = *(double *)((long)&local_158 + lVar48 * 2);
          dVar7 = *(double *)((long)&local_150 + lVar48 * 2);
          dVar8 = *(double *)((long)&local_148.m_data + lVar48 * 2);
          dVar9 = *(double *)((long)&local_148.m_rows + lVar48 * 2);
          *(double *)((long)local_2a8 + lVar48) =
               dVar3 * dVar9 + dVar57 * dVar7 + dVar18 * dVar5 +
               dVar2 * dVar8 + dVar19 * dVar6 + dVar51 * dVar4;
          *(double *)((long)local_2a8 + lVar48 + 8) =
               dVar24 * dVar9 + dVar22 * dVar7 + dVar20 * dVar5 +
               dVar23 * dVar8 + dVar21 * dVar6 + dVar58 * dVar4;
          *(double *)
           ((long)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + lVar48) =
               dVar9 * dVar30 + dVar7 * dVar28 + dVar5 * dVar26 +
               dVar8 * dVar29 + dVar6 * dVar27 + dVar4 * dVar25;
          lVar48 = lVar48 + 0x18;
        } while (lVar48 != 0x58);
        puVar41 = (undefined8 *)((lVar43 * 8 + 8) * local_3a1._1_8_ + lVar42 + 0x10);
        lVar42 = 0x10;
        do {
          uVar36 = *(undefined8 *)((long)local_2a8 + lVar42 + 8);
          puVar41[-2] = *(undefined8 *)((long)local_2a8 + lVar42);
          puVar41[-1] = uVar36;
          *puVar41 = *(undefined8 *)
                      ((long)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + lVar42);
          lVar42 = lVar42 + 0x18;
          puVar41 = puVar41 + lVar43;
        } while (lVar42 != 0x58);
        local_380 = uVar39;
        if ((model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar39] != 0) {
          local_340.m_cols = local_3a1._1_8_ * 8;
          do {
            Math::SpatialTransform::toMatrixTranspose
                      ((SpatialMatrix *)&local_298,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar39);
            dVar30 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x23];
            dVar29 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x22];
            dVar28 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x21];
            dVar27 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x20];
            dVar26 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x1d];
            dVar25 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x1c];
            dVar24 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x1b];
            dVar23 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x1a];
            dVar22 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x17];
            dVar21 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x16];
            dVar20 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x15];
            dVar58 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0x14];
            dVar3 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x11];
            dVar2 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x10];
            dVar57 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0xb];
            dVar19 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[10];
            dVar18 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[1];
            dVar51 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0];
            local_358 = (DenseStorage<double,__1,__1,__1,_0> *)
                        local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0];
            pDStack_350 = (DenseStorage<double,__1,__1,__1,_0> *)
                          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[1];
            local_178 = (DenseStorage<double,__1,__1,__1,_0> *)
                        local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[2];
            pDStack_170 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                           *)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array[3];
            local_a8 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[4];
            dStack_a0 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[5];
            local_b8 = (DenseStorage<double,__1,__1,__1,_0> *)
                       local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[6];
            dStack_b0 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[7];
            local_48 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0xc];
            dStack_40 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xd];
            local_58 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x12];
            dStack_50 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x13];
            local_68 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x18];
            dStack_60 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x19];
            local_78 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x1e];
            dStack_70 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0x1f];
            local_88 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[8];
            dStack_80 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[9];
            local_98 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0xe];
            dStack_90 = local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                        m_storage.m_data.array[0xf];
            lVar42 = 0;
            do {
              dVar4 = *(double *)((long)&local_148.m_data + lVar42);
              dVar5 = *(double *)((long)&local_148.m_rows + lVar42);
              dVar6 = *(double *)((long)&local_148.m_cols + lVar42);
              dVar7 = *(double *)((long)&pDStack_130 + lVar42);
              dVar60 = dStack_b0 * dVar5;
              dVar59 = dStack_40 * dVar6;
              dVar61 = dStack_50 * dVar7;
              dVar8 = *(double *)((long)local_128 + lVar42);
              dVar62 = dStack_60 * dVar8;
              dVar9 = *(double *)((long)local_128 + lVar42 + 8);
              dVar63 = dStack_70 * dVar9;
              *(double *)(local_328 + lVar42) =
                   local_78 * dVar9 +
                   local_68 * dVar8 +
                   local_58 * dVar7 + local_48 * dVar6 + (double)local_b8 * dVar5 + dVar51 * dVar4;
              *(double *)(local_328 + lVar42 + 8) =
                   dVar63 + dVar62 + dVar61 + dVar59 + dVar60 + dVar18 * dVar4;
              dVar59 = (double)pDStack_170 * dVar4;
              dVar61 = dStack_80 * dVar5;
              dVar60 = dStack_90 * dVar6;
              *(double *)((long)&local_318 + lVar42) =
                   dVar27 * dVar9 +
                   dVar23 * dVar8 +
                   dVar58 * dVar7 + local_98 * dVar6 + local_88 * dVar5 + (double)local_178 * dVar4;
              *(double *)((long)&pDStack_310 + lVar42) =
                   dVar28 * dVar9 + dVar24 * dVar8 + dVar20 * dVar7 + dVar60 + dVar61 + dVar59;
              dVar59 = dVar4 * dStack_a0;
              *(double *)((long)local_308 + lVar42) =
                   dVar9 * dVar29 +
                   dVar8 * dVar25 +
                   dVar7 * dVar21 + dVar6 * dVar2 + dVar5 * dVar19 + dVar4 * local_a8;
              *(double *)((long)local_308 + lVar42 + 8) =
                   dVar9 * dVar30 +
                   dVar8 * dVar26 + dVar7 * dVar22 + dVar6 * dVar3 + dVar5 * dVar57 + dVar59;
              lVar42 = lVar42 + 0x30;
            } while (lVar42 != 0x90);
            local_148.m_data = (double *)local_328._0_8_;
            local_148.m_rows = local_328._8_8_;
            local_148.m_cols = (Index)local_318;
            pDStack_130 = pDStack_310;
            local_128[0] = local_308[0];
            local_128[1] = local_308[1];
            local_128[2] = local_308[2];
            local_128[3] = local_308[3];
            local_128[4] = local_308[4];
            dStack_100 = dStack_2e0;
            local_f8 = local_2d8;
            dStack_f0 = dStack_2d0;
            local_e8 = local_2c8;
            dStack_e0 = dStack_2c0;
            local_d8 = local_2b8;
            dStack_d0 = dStack_2b0;
            local_c8 = local_2a8[0];
            dStack_c0 = local_2a8[1];
            pJVar12 = (model->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar39 = (ulong)(model->lambda).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar39];
            dVar51 = (double)(ulong)pJVar12[uVar39].q_index;
            if (pJVar12[uVar39].mJointType == JointTypeCustom) {
              ppCVar14 = (model->mCustomJoints).
                         super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              uVar38 = *(uint *)(ppCVar14[pJVar12[uVar39].custom_joint_index] + 8);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[1] = (double)(ppCVar14[pJVar12[uVar39].custom_joint_index] + 0x70);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] = (double)&local_148;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_3a1 + 9),
                         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                          *)&local_298);
              uVar36 = local_3a1._1_8_;
              local_378.m_cols = *(Index *)((long)H + 8);
              local_378.m_data =
                   (double *)(*(long *)H + local_340.m_cols + (long)dVar51 * local_378.m_cols * 8);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[1] = 1.48219693752374e-323;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[4] = (double)local_3a1._1_8_;
              local_340.m_data = local_398.m_data;
              local_340.m_rows = local_398.m_rows;
              local_328._0_8_ = &local_378;
              local_328._8_8_ = &local_340;
              local_318 = (DenseStorage<double,__1,__1,__1,_0> *)local_3a1;
              pDStack_310 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                             *)&local_298;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] = (double)local_378.m_data;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[2] = (double)(ulong)uVar38;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[3] = (double)H;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[5] = dVar51;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] = (double)local_378.m_cols;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_328);
              model = local_158;
              lVar43 = *(long *)((long)H + 8);
              lVar42 = (long)dVar51 * 8 + *(long *)H + lVar43 * uVar36 * 8;
              lVar48 = 0;
              pdVar44 = local_398.m_data;
              do {
                if (uVar38 != 0) {
                  pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar50 = pdVar44;
                  do {
                    *(double *)(lVar42 + (long)pDVar45 * 8) = *pdVar50;
                    pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
                    pdVar50 = pdVar50 + local_398.m_rows;
                  } while ((DenseStorage<double,__1,__1,__1,_0> *)(ulong)uVar38 != pDVar45);
                }
                lVar48 = lVar48 + 1;
                pdVar44 = pdVar44 + 1;
                lVar42 = lVar42 + lVar43 * 8;
              } while (lVar48 != 3);
              free(local_398.m_data);
              H = (MatrixNd *)local_150;
            }
            else if (pJVar12[uVar39].mDoFCount == 3) {
              local_328._8_8_ =
                   (model->multdof3_S).
                   super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39;
              local_328._0_8_ = &local_148;
              Matrix3_t::
              Matrix3_t<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                        ((Matrix3_t *)&local_298,
                         (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                          *)local_328);
              lVar42 = *(long *)((long)H + 8);
              puVar41 = (undefined8 *)
                        (*(long *)H + local_340.m_cols + lVar42 * 8 * (long)dVar51 + 0x10);
              lVar43 = 0x10;
              do {
                uVar36 = *(undefined8 *)((long)local_2a8 + lVar43 + 8);
                puVar41[-2] = *(undefined8 *)((long)local_2a8 + lVar43);
                puVar41[-1] = uVar36;
                *puVar41 = *(undefined8 *)
                            ((long)local_298.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array + lVar43);
                lVar43 = lVar43 + 0x18;
                puVar41 = puVar41 + lVar42;
              } while (lVar43 != 0x58);
              lVar52 = (long)dVar51 * 8 + *(long *)H;
              lVar43 = *(long *)((long)H + 8);
              lVar48 = lVar43 * local_3a1._1_8_;
              lVar42 = lVar52 + lVar48 * 8;
              *(double *)(lVar52 + lVar48 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0];
              *(double *)(lVar52 + 8 + lVar48 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[3];
              *(double *)(lVar52 + 0x10 + lVar48 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[6];
              *(double *)(lVar42 + lVar43 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[1];
              *(double *)(lVar42 + 8 + lVar43 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
              *(double *)(lVar42 + 0x10 + lVar43 * 8) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[7];
              lVar43 = lVar43 * 0x10;
              *(double *)(lVar43 + lVar42) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[2];
              *(double *)(lVar43 + 8 + lVar42) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
              *(double *)(lVar43 + 0x10 + lVar42) =
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[8];
            }
            else if (pJVar12[uVar39].mDoFCount == 1) {
              pSVar55 = (model->S).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar57 = *(double *)
                        &pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
              dVar2 = *(double *)
                       ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
              pdVar44 = (double *)
                        ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10)
              ;
              dVar3 = *pdVar44;
              dVar58 = pdVar44[1];
              pdVar44 = (double *)
                        ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20)
              ;
              dVar20 = *pdVar44;
              dVar21 = pdVar44[1];
              dVar18 = local_308[1] * dVar21 + (double)pDStack_310 * dVar58 +
                       (double)local_328._8_8_ * dVar2 +
                       local_308[0] * dVar20 + (double)local_318 * dVar3 +
                       (double)local_328._0_8_ * dVar57;
              dVar19 = dStack_2d0 * dVar21 + dStack_2e0 * dVar58 + local_308[3] * dVar2 +
                       local_2d8 * dVar20 + local_308[4] * dVar3 + local_308[2] * dVar57;
              dVar57 = local_2a8[1] * dVar21 + dStack_2b0 * dVar58 + dStack_2c0 * dVar2 +
                       local_2a8[0] * dVar20 + local_2b8 * dVar3 + local_2c8 * dVar57;
              lVar42 = *(long *)H;
              lVar43 = *(long *)((long)H + 8);
              auVar17._8_4_ = SUB84(dVar19,0);
              auVar17._0_8_ = dVar18;
              auVar17._12_4_ = (int)((ulong)dVar19 >> 0x20);
              *(undefined1 (*) [16])(lVar42 + local_340.m_cols + lVar43 * (long)dVar51 * 8) =
                   auVar17;
              *(double *)(lVar42 + local_340.m_cols + 0x10 + lVar43 * (long)dVar51 * 8) = dVar57;
              lVar48 = (long)dVar51 * 8 + *(long *)H;
              lVar43 = *(long *)((long)H + 8);
              lVar42 = lVar48 + lVar43 * local_3a1._1_8_ * 8;
              *(double *)(lVar48 + lVar43 * local_3a1._1_8_ * 8) = dVar18;
              *(double *)(lVar42 + lVar43 * 8) = dVar19;
              *(double *)(lVar43 * 0x10 + lVar42) = dVar57;
            }
            uVar54 = local_380;
          } while ((model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar39] != 0);
        }
      }
      else if ((pJVar12[uVar39].mDoFCount == 1) && (pJVar12[uVar39].mJointType != JointTypeCustom))
      {
        Math::SpatialRigidBodyInertia::operator*
                  ((model->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39,
                   (model->S).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar39);
        pSVar55 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar44 = (double *)
                  ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar50 = (double *)
                  ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *(double *)(*(long *)((long)H + 8) * local_3a1._1_8_ * 8 + *(long *)H + local_3a1._1_8_ * 8)
             = pdVar50[1] *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[5] +
               pdVar44[1] *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[3] +
               *(double *)
                ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[1] +
               *pdVar50 *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[4] +
               *pdVar44 *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[2] +
               *(double *)
                &pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
               local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0];
        uVar38 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar39];
        while (local_380 = uVar54, uVar38 != 0) {
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar39,(SpatialVector *)&local_298)
          ;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[4] = local_308[0];
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[5] = local_308[1];
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[2] = (double)local_318;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[3] = (double)pDStack_310;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[0] = (double)local_328._0_8_;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[1] = (double)local_328._8_8_;
          pJVar12 = (model->mJoints).
                    super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar39 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar39];
          uVar54 = (ulong)pJVar12[uVar39].q_index;
          if (pJVar12[uVar39].mJointType == JointTypeCustom) {
            ppCVar14 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            uVar38 = *(uint *)(ppCVar14[pJVar12[uVar39].custom_joint_index] + 8);
            uVar53 = (ulong)uVar38;
            pCVar13 = ppCVar14[pJVar12[uVar39].custom_joint_index];
            local_148.m_data = (double *)0x0;
            local_148.m_rows = 0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                       *(Index *)(pCVar13 + 0x80),1);
            local_328._0_8_ = (LhsNested)0x0;
            local_328._8_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
            local_318 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)(local_328 + 8),1
                       ,*(Index *)(pCVar13 + 0x80));
            local_328._0_8_ = local_328._8_8_;
            if (local_318 != *(DenseStorage<double,__1,__1,__1,_0> **)(pCVar13 + 0x80)) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)(local_328 + 8)
                         ,1,(Index)*(DenseStorage<double,__1,__1,__1,_0> **)(pCVar13 + 0x80));
            }
            if (0 < (long)local_318) {
              lVar42 = *(long *)(pCVar13 + 0x78);
              pdVar44 = (double *)(*(long *)(pCVar13 + 0x70) + 0x20);
              pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
              do {
                ((double **)local_328._8_8_)[(long)pDVar45] =
                     (double *)
                     (pdVar44[1] *
                      local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[5] +
                      pdVar44[-1] *
                      local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[3] +
                      pdVar44[-3] *
                      local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array[1] +
                     *pdVar44 *
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[4] +
                     pdVar44[-2] *
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[2] +
                     pdVar44[-4] *
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0]);
                pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
                pdVar44 = pdVar44 + lVar42;
              } while (local_318 != pDVar45);
            }
            if ((DenseStorage<double,__1,__1,__1,_0> *)local_148.m_rows !=
                *(DenseStorage<double,__1,__1,__1,_0> **)(pCVar13 + 0x80)) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                         (Index)*(DenseStorage<double,__1,__1,__1,_0> **)(pCVar13 + 0x80),1);
            }
            pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (local_148.m_rows - (local_148.m_rows >> 0x3f) & 0xfffffffffffffffe);
            if (1 < local_148.m_rows) {
              lVar42 = 0;
              do {
                ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                            local_328._0_8_)->m_storage).m_data + lVar42;
                IVar37 = (Index)ppdVar1[1];
                ((double **)local_148.m_data)[lVar42] = *ppdVar1;
                ((double **)local_148.m_data + lVar42)[1] = (double *)IVar37;
                lVar42 = lVar42 + 2;
              } while (lVar42 < (long)pDVar45);
            }
            if ((long)pDVar45 < local_148.m_rows) {
              do {
                ((double **)local_148.m_data)[(long)pDVar45] =
                     (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        local_328._0_8_)->m_storage).m_data)[(long)pDVar45];
                pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
              } while ((DenseStorage<double,__1,__1,__1,_0> *)local_148.m_rows != pDVar45);
            }
            free((void *)local_328._8_8_);
            lVar42 = *(long *)H;
            lVar43 = *(long *)((long)H + 8);
            if (uVar53 != 0) {
              puVar41 = (undefined8 *)(lVar42 + local_3a1._1_8_ * 8 + uVar54 * lVar43 * 8);
              uVar49 = 0;
              do {
                *puVar41 = ((double **)local_148.m_data)[uVar49];
                uVar49 = uVar49 + 1;
                puVar41 = puVar41 + lVar43;
              } while (uVar53 != uVar49);
            }
            puVar41 = (undefined8 *)(lVar42 + uVar54 * 8 + lVar43 * local_3a1._1_8_ * 8);
            if (((ulong)puVar41 & 7) == 0) {
              uVar54 = (ulong)((uint)((ulong)puVar41 >> 3) & 1);
              if (uVar53 <= uVar54) {
                uVar54 = uVar53;
              }
              if ((uVar54 & 1) != 0) {
                *puVar41 = *(double **)local_148.m_data;
              }
              uVar47 = uVar53 - uVar54 & 0xfffffffffffffffe;
              uVar49 = uVar47 | uVar54;
              if (0 < (long)uVar47) {
                do {
                  IVar37 = (Index)((double **)local_148.m_data + uVar54)[1];
                  puVar41[uVar54] = ((double **)local_148.m_data)[uVar54];
                  (puVar41 + uVar54)[1] = IVar37;
                  uVar54 = uVar54 + 2;
                } while ((long)uVar54 < (long)uVar49);
              }
              for (; (long)uVar49 < (long)uVar53; uVar49 = uVar49 + 1) {
                puVar41[uVar49] = ((double **)local_148.m_data)[uVar49];
              }
            }
            else if (uVar38 != 0) {
              uVar54 = 0;
              do {
                puVar41[uVar54] = ((double **)local_148.m_data)[uVar54];
                uVar54 = uVar54 + 1;
              } while (uVar53 != uVar54);
            }
            free(local_148.m_data);
          }
          else if (pJVar12[uVar39].mDoFCount == 3) {
            local_148.m_rows =
                 (Index)((model->multdof3_S).
                         super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         .
                         super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar39);
            local_148.m_data = (double *)&local_298;
            Vector3_t::
            Vector3_t<Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>,Eigen::Matrix<double,6,3,0,6,3>,0>const>>
                      ((Vector3_t *)local_328,
                       (MatrixBase<Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
                        *)&local_148);
            lVar48 = *(long *)H;
            lVar52 = *(long *)((long)H + 8);
            lVar42 = lVar48 + local_3a1._1_8_ * 8;
            lVar43 = lVar42 + lVar52 * uVar54 * 8;
            *(undefined8 *)(lVar42 + lVar52 * uVar54 * 8) = local_328._0_8_;
            *(undefined8 *)(lVar43 + lVar52 * 8) = local_328._8_8_;
            *(DenseStorage<double,__1,__1,__1,_0> **)(lVar52 * 0x10 + lVar43) = local_318;
            lVar48 = lVar48 + uVar54 * 8;
            puVar41 = (undefined8 *)(lVar48 + lVar52 * local_3a1._1_8_ * 8);
            *puVar41 = local_328._0_8_;
            puVar41[1] = local_328._8_8_;
            *(DenseStorage<double,__1,__1,__1,_0> **)(lVar48 + 0x10 + lVar52 * local_3a1._1_8_ * 8)
                 = local_318;
          }
          else if (pJVar12[uVar39].mDoFCount == 1) {
            pSVar55 = (model->S).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar44 = (double *)
                      ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            pdVar50 = (double *)
                      ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar51 = local_308[1] * pdVar50[1] + (double)pDStack_310 * pdVar44[1] +
                     (double)local_328._8_8_ *
                     *(double *)
                      ((long)&pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                     local_308[0] * *pdVar50 + (double)local_318 * *pdVar44 +
                     (double)local_328._0_8_ *
                     *(double *)
                      &pSVar55[uVar39].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            lVar42 = *(long *)H;
            lVar43 = *(long *)((long)H + 8);
            *(double *)(lVar42 + uVar54 * lVar43 * 8 + local_3a1._1_8_ * 8) = dVar51;
            *(double *)(lVar42 + lVar43 * local_3a1._1_8_ * 8 + uVar54 * 8) = dVar51;
          }
          uVar54 = local_380;
          uVar38 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar39];
        }
      }
      else {
LAB_0016fe44:
        if (pJVar12[uVar39].mJointType == JointTypeCustom) {
          uVar38 = pJVar12[uVar39].custom_joint_index;
          local_178 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (ulong)*(uint *)((model->mCustomJoints).
                                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar38] + 8);
          Math::SpatialRigidBodyInertia::toMatrix
                    ((model->Ic).
                     super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar39);
          pCVar13 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar38];
          local_328._8_8_ = pCVar13 + 0x70;
          local_378.m_data = (double *)0x0;
          local_378.m_rows = 0;
          local_378.m_cols = 0;
          lVar42 = *(long *)(pCVar13 + 0x80);
          local_328._0_8_ = &local_298;
          if ((lVar42 != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar42),0) < 6)) {
            puVar41 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar41 = operator_new;
            __cxa_throw(puVar41,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_378,lVar42 * 6,6,lVar42);
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_378,(SrcXprType *)local_328,
                (assign_op<double,_double> *)&local_148);
          local_328._0_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar38] + 0x70;
          local_358 = (DenseStorage<double,__1,__1,__1,_0> *)(local_3a1._1_8_ * 8);
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[6] = *(double *)((long)H + 8);
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[0] = (double)((long)&local_358->m_data +
                             (long)local_298.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[6] * local_3a1._1_8_ * 8 + *(long *)H);
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[1] = (double)local_178;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[2] = (double)local_178;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[4] = (double)local_3a1._1_8_;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[5] = (double)local_3a1._1_8_;
          local_328._8_8_ = &local_378;
          local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
          array[3] = (double)H;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_298,
                     (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                      *)local_328,(assign_op<double,_double> *)&local_148,(type)0x0);
          uVar38 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar39];
          local_380 = uVar39;
          while (uVar38 != 0) {
            Math::SpatialTransform::toMatrixTranspose
                      ((SpatialMatrix *)&local_298,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar39);
            local_328._8_8_ = &local_378;
            local_328._0_8_ = (DenseStorage<double,__1,__1,__1,_0> *)&local_298;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_328._8_8_,
                       (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)local_328,(assign_op<double,_double> *)&local_148,(type)0x0);
            pJVar12 = (model->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar39 = (ulong)(model->lambda).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar39];
            dVar51 = (double)(ulong)pJVar12[uVar39].q_index;
            if (pJVar12[uVar39].mJointType == JointTypeCustom) {
              ppCVar14 = (model->mCustomJoints).
                         super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              uVar38 = *(uint *)(ppCVar14[pJVar12[uVar39].custom_joint_index] + 8);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[1] = (double)(ppCVar14[pJVar12[uVar39].custom_joint_index] + 0x70);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] = (double)&local_378;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_3a1 + 9),
                         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                          *)&local_298);
              uVar36 = local_3a1._1_8_;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] = *(double *)((long)H + 8);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] =
                   (double)((long)&local_358->m_data +
                           (long)dVar51 *
                           (long)local_298.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[6] * 8 + *(long *)H);
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[1] = 1.48219693752374e-323;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[4] = (double)local_3a1._1_8_;
              local_340.m_data = local_398.m_data;
              local_340.m_rows = local_398.m_rows;
              local_328._0_8_ = &local_148;
              local_328._8_8_ = &local_340;
              local_318 = (DenseStorage<double,__1,__1,__1,_0> *)local_3a1;
              pDStack_310 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                             *)&local_298;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[2] = (double)(ulong)uVar38;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[3] = (double)H;
              local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[5] = dVar51;
              local_148.m_data =
                   (double *)
                   local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0];
              local_148.m_cols =
                   (Index)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[6];
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_328);
              model = local_158;
              lVar43 = *(long *)((long)H + 8);
              lVar42 = (long)dVar51 * 8 + *(long *)H + lVar43 * uVar36 * 8;
              lVar48 = 0;
              pdVar44 = local_398.m_data;
              do {
                if (uVar38 != 0) {
                  pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar50 = pdVar44;
                  do {
                    *(double *)(lVar42 + (long)pDVar45 * 8) = *pdVar50;
                    pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
                    pdVar50 = pdVar50 + local_398.m_rows;
                  } while ((DenseStorage<double,__1,__1,__1,_0> *)(ulong)uVar38 != pDVar45);
                }
                lVar48 = lVar48 + 1;
                pdVar44 = pdVar44 + 1;
                lVar42 = lVar42 + lVar43 * 8;
              } while (lVar48 != 3);
              free(local_398.m_data);
              H = (MatrixNd *)local_150;
            }
            else {
              if (pJVar12[uVar39].mDoFCount == 3) {
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[1] =
                     (double)((model->multdof3_S).
                              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              .
                              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0] = (double)&local_378;
                Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                          ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_3a1 + 9),
                           (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                            *)&local_298);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[6] = *(double *)((long)H + 8);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0] =
                     (double)((long)&local_358->m_data +
                             (long)local_298.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[6] * (long)dVar51 * 8 + *(long *)H);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[1] = (double)local_398.m_rows;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[2] = (double)local_398.m_cols;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[4] = (double)local_3a1._1_8_;
                local_340.m_data = local_398.m_data;
                local_340.m_rows = local_398.m_rows;
                local_328._8_8_ = &local_340;
                local_318 = (DenseStorage<double,__1,__1,__1,_0> *)local_3a1;
                local_328._0_8_ = &local_148;
                pDStack_310 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                               *)&local_298;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[3] = (double)H;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[5] = dVar51;
                local_148.m_data =
                     (double *)
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0];
                local_148.m_cols =
                     (Index)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                            m_storage.m_data.array[6];
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)local_328);
                if (0 < local_398.m_rows) {
                  lVar43 = *(long *)((long)H + 8);
                  lVar42 = (long)dVar51 * 8 + *(long *)H + lVar43 * local_3a1._1_8_ * 8;
                  pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar44 = local_398.m_data;
                  do {
                    if (0 < local_398.m_cols) {
                      pDVar56 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                      pdVar50 = pdVar44;
                      do {
                        *(double *)(lVar42 + (long)pDVar56 * 8) = *pdVar50;
                        pDVar56 = (DenseStorage<double,__1,__1,__1,_0> *)
                                  ((long)&pDVar56->m_data + 1);
                        pdVar50 = pdVar50 + local_398.m_rows;
                      } while ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols != pDVar56);
                    }
                    pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
                    pdVar44 = pdVar44 + 1;
                    lVar42 = lVar42 + lVar43 * 8;
                  } while (pDVar45 != (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows);
                }
              }
              else {
                if (pJVar12[uVar39].mDoFCount != 1) goto LAB_00170559;
                pSVar55 = (model->S).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar39;
                local_398.m_data = (double *)0x0;
                local_398.m_rows = 0;
                local_398.m_cols = 0;
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                          ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols,
                           local_378.m_cols,1);
                if ((local_398.m_rows != local_378.m_cols) ||
                   ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols !=
                    (DenseStorage<double,__1,__1,__1,_0> *)0x1)) {
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols
                             ,local_378.m_cols,1);
                }
                if ((local_398.m_rows != local_378.m_cols) ||
                   ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols !=
                    (DenseStorage<double,__1,__1,__1,_0> *)0x1)) {
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols
                             ,local_378.m_cols,1);
                }
                if (0 < local_398.m_cols * local_398.m_rows) {
                  pIVar46 = &((DenseStorage<double,__1,__1,__1,_0> *)((long)local_378.m_data + 0x18)
                             )->m_rows;
                  lVar42 = 0;
                  do {
                    local_398.m_data[lVar42] =
                         *(double *)
                          ((long)&(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x28) * (double)pIVar46[1] +
                         *(double *)
                          ((long)&(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x18) * (double)((DenseStorage<double,__1,__1,__1,_0> *)(pIVar46 + -1))->
                                          m_data +
                         *(double *)
                          ((long)&(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8)
                         * (double)pIVar46[-3] +
                         *(double *)
                          ((long)&(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x20) * (double)*pIVar46 +
                         *(double *)
                          ((long)&(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x10) * (double)pIVar46[-2] +
                         *(double *)
                          &(pSVar55->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                         (double)pIVar46[-4];
                    lVar42 = lVar42 + 1;
                    pIVar46 = pIVar46 + local_378.m_rows;
                  } while (local_398.m_cols * local_398.m_rows - lVar42 != 0);
                }
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[6] = *(double *)((long)H + 8);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0] =
                     (double)((long)&local_358->m_data +
                             (long)local_298.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[6] * (long)dVar51 * 8 + *(long *)H);
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[1] = (double)local_398.m_rows;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[2] = (double)local_398.m_cols;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[4] = (double)local_3a1._1_8_;
                local_340.m_data = local_398.m_data;
                local_340.m_rows = local_398.m_rows;
                local_328._8_8_ = &local_340;
                local_318 = (DenseStorage<double,__1,__1,__1,_0> *)local_3a1;
                pDStack_310 = (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                               *)&local_298;
                local_328._0_8_ = &local_148;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[3] = (double)H;
                local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[5] = dVar51;
                local_148.m_data =
                     (double *)
                     local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array[0];
                local_148.m_cols =
                     (Index)local_298.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                            m_storage.m_data.array[6];
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)local_328);
                if (0 < local_398.m_rows) {
                  lVar43 = *(long *)((long)H + 8);
                  lVar42 = (long)dVar51 * 8 + *(long *)H + lVar43 * local_3a1._1_8_ * 8;
                  pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar44 = local_398.m_data;
                  do {
                    if (0 < local_398.m_cols) {
                      pDVar56 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                      pdVar50 = pdVar44;
                      do {
                        *(double *)(lVar42 + (long)pDVar56 * 8) = *pdVar50;
                        pDVar56 = (DenseStorage<double,__1,__1,__1,_0> *)
                                  ((long)&pDVar56->m_data + 1);
                        pdVar50 = pdVar50 + local_398.m_rows;
                      } while ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols != pDVar56);
                    }
                    pDVar45 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar45->m_data + 1);
                    pdVar44 = pdVar44 + 1;
                    lVar42 = lVar42 + lVar43 * 8;
                  } while (pDVar45 != (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows);
                }
              }
              free(local_398.m_data);
            }
LAB_00170559:
            uVar38 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar39];
          }
          free(local_378.m_data);
          uVar54 = local_380;
        }
      }
      uVar39 = uVar54 - 1;
      adStack_168[1] = (double)((long)adStack_168[1] + -0x90);
    } while ((int)uVar39 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CompositeRigidBodyAlgorithm (
    Model& model,
    const VectorNd &Q,
    MatrixNd &H,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  assert (H.rows() == model.dof_count && H.cols() == model.dof_count);

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (update_kinematics) {
      jcalc_X_lambda_S (model, i, Q);
    }
    model.Ic[i] = model.I[i];
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if (model.lambda[i] != 0) {
      model.Ic[model.lambda[i]] = model.Ic[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.Ic[i]);
    }

    unsigned int dof_index_i = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1 
        && model.mJoints[i].mJointType != JointTypeCustom) {

      SpatialVector F             = model.Ic[i] * model.S[i];
      H(dof_index_i, dof_index_i) = model.S[i].dot(F);

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F = model.X_lambda[j].applyTranspose(F);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom) {
          if (model.mJoints[j].mDoFCount == 1) {
            H(dof_index_i,dof_index_j) = F.dot(model.S[j]);
            H(dof_index_j,dof_index_i) = H(dof_index_i,dof_index_j);
          } else if (model.mJoints[j].mDoFCount == 3) {
            Vector3d H_temp2 = 
              (F.transpose() * model.multdof3_S[j]).transpose();
            LOG << F.transpose() << std::endl 
              << model.multdof3_S[j] << std::endl;
            LOG << H_temp2.transpose() << std::endl;

            H.block<1,3>(dof_index_i,dof_index_j) = H_temp2.transpose();
            H.block<3,1>(dof_index_j,dof_index_i) = H_temp2;
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){        
          unsigned int k      = model.mJoints[j].custom_joint_index;
          unsigned int dof    = model.mCustomJoints[k]->mDoFCount;
          VectorNd H_temp2    =
            (F.transpose() * model.mCustomJoints[k]->S).transpose();

          LOG << F.transpose()
            << std::endl
            << model.mCustomJoints[j]->S << std::endl;

          LOG << H_temp2.transpose() << std::endl;

          H.block(dof_index_i,dof_index_j,1,dof) = H_temp2.transpose();
          H.block(dof_index_j,dof_index_i,dof,1) = H_temp2;
        }
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Matrix63 F_63 = model.Ic[i].toMatrix() * model.multdof3_S[i];
      H.block<3,3>(dof_index_i, dof_index_i) = model.multdof3_S[i].transpose() * F_63;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_63 = model.X_lambda[j].toMatrixTranspose() * (F_63);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            Vector3d H_temp2 = F_63.transpose() * (model.S[j]);

            H.block<3,1>(dof_index_i,dof_index_j) = H_temp2;
            H.block<1,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            Matrix3d H_temp2 = F_63.transpose() * (model.multdof3_S[j]);

            H.block<3,3>(dof_index_i,dof_index_j) = H_temp2;
            H.block<3,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_63.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {      
      unsigned int kI = model.mJoints[i].custom_joint_index;
      unsigned int dofI = model.mCustomJoints[kI]->mDoFCount;

      MatrixNd F_Nd = model.Ic[i].toMatrix()
        * model.mCustomJoints[kI]->S;

      H.block(dof_index_i, dof_index_i,dofI,dofI)
        = model.mCustomJoints[kI]->S.transpose() * F_Nd;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_Nd = model.X_lambda[j].toMatrixTranspose() * (F_Nd);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.S[j]);
            H.block(   dof_index_i,  dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.multdof3_S[j]);
            H.block(dof_index_i,   dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,   dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k   = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_Nd.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    }
  }
}